

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  float fVar3;
  float wt;
  float val;
  int l;
  float *sptr;
  Mat m_1;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  int z_1;
  float *outptr;
  int p;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int kernel_extend_d;
  int kernel_extend_h;
  int kernel_extend_w;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_2;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  size_t in_stack_fffffffffffff988;
  void **ppvVar4;
  int in_stack_fffffffffffff990;
  float in_stack_fffffffffffff994;
  int in_stack_fffffffffffff998;
  int in_stack_fffffffffffff99c;
  Mat *in_stack_fffffffffffff9a0;
  Allocator *in_stack_fffffffffffffa00;
  bool local_599;
  int local_57c;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined4 local_560;
  long *local_558;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  Option *in_stack_fffffffffffffac8;
  Mat *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  Convolution3D *in_stack_fffffffffffffae0;
  int local_4dc;
  long local_4d8;
  float local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  long local_478;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  reference local_450;
  vector<int,_std::allocator<int>_> local_440;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  undefined4 local_418;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  ulong local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  void *local_3c0;
  int *local_3b8;
  long local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  long local_380;
  int local_374;
  int local_370;
  int local_36c;
  undefined8 local_368;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  long *local_348;
  int local_32c;
  void **local_328;
  undefined8 *local_320;
  undefined8 *local_310;
  undefined1 *local_300;
  void **local_2f0;
  long *local_2e0;
  void **local_2d8;
  undefined1 local_2cd;
  int local_2cc;
  void **local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2ad;
  int local_2ac;
  undefined8 *local_2a0;
  undefined8 *local_290;
  long local_288;
  long *local_280;
  long *local_278;
  int local_26c;
  undefined1 *local_268;
  undefined8 *local_260;
  int local_254;
  undefined8 *local_250;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  long *local_220;
  undefined4 local_218;
  float local_214 [3];
  long *local_208;
  undefined8 local_200;
  long *local_1f8;
  undefined8 local_1f0;
  long *local_1e8;
  undefined8 local_1e0;
  long *local_1d8;
  undefined8 local_1d0;
  long *local_1c8;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  undefined1 *local_168;
  undefined8 *local_148;
  undefined8 *local_128;
  void *local_f0;
  void **local_d0;
  long *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long *local_88;
  undefined4 local_7c;
  long local_78;
  void *local_70;
  undefined1 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  long *local_30;
  undefined4 local_24;
  long local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_354 = *(int *)(in_RSI + 0x2c);
  local_358 = *(int *)(in_RSI + 0x30);
  local_35c = *(int *)(in_RSI + 0x34);
  local_360 = *(int *)(in_RSI + 0x38);
  local_368 = *(undefined8 *)(in_RSI + 0x10);
  local_36c = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_370 = *(int *)(in_RDI + 0xe4) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_374 = *(int *)(in_RDI + 0xe8) * (*(int *)(in_RDI + 0xdc) + -1) + 1;
  local_328 = &local_3c0;
  local_3c0 = (void *)0x0;
  local_3b8 = (int *)0x0;
  local_3b0 = 0;
  local_3a8 = 0;
  local_3a0 = (long *)0x0;
  local_398 = 0;
  local_394 = 0;
  local_390 = 0;
  local_38c = 0;
  local_388 = 0;
  local_380 = 0;
  local_408 = *in_RCX;
  uStack_400 = in_RCX[1];
  local_3f8 = *(undefined4 *)(in_RCX + 2);
  uStack_3f4 = *(undefined4 *)((long)in_RCX + 0x14);
  uStack_3f0 = *(undefined4 *)(in_RCX + 3);
  uStack_3ec = *(undefined4 *)((long)in_RCX + 0x1c);
  uStack_3e0 = in_RCX[5];
  local_3d8 = in_RCX[6];
  uStack_3d0 = in_RCX[7];
  local_3e8 = in_RCX[4] & 0xffffffffffffff;
  local_348 = in_RDX;
  make_padding(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8);
  local_2d8 = &local_3c0;
  if (local_3c0 != (void *)0x0) {
    local_d0 = local_2d8;
  }
  local_599 = local_3c0 != (void *)0x0 && local_380 * local_388 != 0;
  if (local_599) {
    local_354 = local_394;
    local_358 = local_390;
    local_35c = local_38c;
    local_41c = (local_394 - local_36c) / *(int *)(in_RDI + 0xec) + 1;
    local_420 = (local_390 - local_370) / *(int *)(in_RDI + 0xf0) + 1;
    local_424 = (local_38c - local_374) / *(int *)(in_RDI + 0xf4) + 1;
    local_428 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
    std::allocator<int>::allocator((allocator<int> *)0x1d47bf4);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9a0,
               CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               (allocator_type *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    std::allocator<int>::~allocator((allocator<int> *)0x1d47c20);
    local_450 = std::vector<int,_std::allocator<int>_>::operator[](&local_440,0);
    local_454 = 0;
    local_458 = 0;
    local_45c = local_354 * *(int *)(in_RDI + 0xe4) -
                *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xe0);
    local_460 = local_358 * local_354 * *(int *)(in_RDI + 0xe8) -
                local_354 * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xe4);
    for (local_464 = 0; local_464 < *(int *)(in_RDI + 0xdc); local_464 = local_464 + 1) {
      for (local_468 = 0; local_468 < *(int *)(in_RDI + 0xd8); local_468 = local_468 + 1) {
        for (local_46c = 0; local_46c < *(int *)(in_RDI + 0xd4); local_46c = local_46c + 1) {
          local_450[local_454] = local_458;
          local_454 = local_454 + 1;
          local_458 = *(int *)(in_RDI + 0xe0) + local_458;
        }
        local_458 = local_45c + local_458;
      }
      local_458 = local_460 + local_458;
    }
    Mat::create(in_stack_fffffffffffff9a0,in_stack_fffffffffffff99c,in_stack_fffffffffffff998,
                (int)in_stack_fffffffffffff994,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                in_stack_fffffffffffffa00);
    local_2e0 = local_348;
    bVar2 = true;
    if (*local_348 != 0) {
      local_c8 = local_348;
      bVar2 = local_348[8] * (long)(int)local_348[7] == 0;
    }
    if (bVar2) {
      local_32c = -100;
    }
    else {
      for (local_470 = 0; local_470 < *(int *)(in_RDI + 0xd0); local_470 = local_470 + 1) {
        local_2a0 = &local_4c0;
        local_94 = *(int *)((long)local_348 + 0x2c);
        local_98 = (int)local_348[6];
        local_9c = *(undefined4 *)((long)local_348 + 0x34);
        local_478 = *local_348 + local_348[8] * (long)local_470 * local_348[2];
        local_b0 = local_348[2];
        local_b4 = (undefined4)local_348[3];
        local_c0 = local_348[4];
        local_90 = &local_4c0;
        local_38 = (long)local_94 * (long)local_98 * local_b0;
        local_290 = &local_4c0;
        local_320 = &local_4c0;
        local_3c = 0x10;
        local_2ac = local_470;
        local_2ad = 1;
        local_4c0 = 0;
        local_4b0 = 0;
        local_4a8 = 0;
        local_498 = 0;
        local_494 = 0;
        local_490 = 0;
        local_48c = 0;
        local_488 = 0;
        local_480 = 0;
        local_4b8 = 0;
        local_128 = local_320;
        local_a8 = local_478;
        local_4a0 = local_c0;
        for (local_4c4 = 0; local_4c4 < local_424; local_4c4 = local_4c4 + 1) {
          for (local_4c8 = 0; local_4c8 < local_420; local_4c8 = local_4c8 + 1) {
            for (local_4cc = 0; local_4cc < local_41c; local_4cc = local_4cc + 1) {
              local_4d0 = 0.0;
              if (*(int *)(in_RDI + 0x114) != 0) {
                local_280 = (long *)(in_RDI + 0x1b0);
                local_288 = (long)local_470;
                local_4d0 = *(float *)(*local_280 + local_288 * 4);
              }
              local_278 = (long *)(in_RDI + 0x168);
              local_4d8 = *local_278 + (long)(local_428 * local_360 * local_470) * 4;
              for (local_4dc = 0; local_4dc < local_360; local_4dc = local_4dc + 1) {
                local_2c0 = &stack0xfffffffffffffad8;
                local_2c8 = &local_3c0;
                local_70 = (void *)((long)local_3c0 + local_380 * local_4dc * local_3b0);
                local_58 = &stack0xfffffffffffffad8;
                local_48 = (long)local_394 * (long)local_390 * local_3b0;
                local_26c = local_4c4 * *(int *)(in_RDI + 0xf4);
                local_260 = &local_578;
                local_268 = &stack0xfffffffffffffad8;
                local_18 = (void *)((long)local_70 +
                                   (long)local_394 * (long)local_390 * (long)local_26c * local_3b0);
                local_8 = &local_578;
                local_254 = local_4c8 * *(int *)(in_RDI + 0xf0);
                local_250 = &local_578;
                local_310 = &local_578;
                local_558 = local_3a0;
                local_c = local_394;
                local_10 = local_390;
                local_20 = local_3b0;
                local_24 = local_3a8;
                local_30 = local_3a0;
                local_4c = 0x10;
                local_78 = local_3b0;
                local_7c = local_3a8;
                local_88 = local_3a0;
                local_2cc = local_4dc;
                local_2cd = 1;
                local_578 = 0;
                local_568 = 0;
                local_560 = 0;
                local_550 = 0;
                local_54c = 0;
                local_548 = 0;
                local_544 = 0;
                local_540 = 0;
                local_570 = 0;
                for (local_57c = 0; local_57c < local_428; local_57c = local_57c + 1) {
                  local_4d0 = *(float *)((long)local_18 +
                                        (long)local_450[local_57c] * 4 +
                                        (long)(local_4cc * *(int *)(in_RDI + 0xec)) * 4 +
                                        (long)local_394 * (long)local_254 * local_3b0) *
                              *(float *)(local_4d8 + (long)local_57c * 4) + local_4d0;
                }
                local_4d8 = local_4d8 + (long)local_428 * 4;
                local_300 = &stack0xfffffffffffffad8;
                local_168 = local_300;
                local_148 = local_310;
              }
              local_218 = *(undefined4 *)(in_RDI + 0x11c);
              local_220 = (long *)(in_RDI + 0x120);
              local_214[0] = local_4d0;
              switch(local_218) {
              case 1:
                if (local_4d0 <= 0.0) {
                  local_214[0] = 0.0;
                }
                break;
              case 2:
                local_1d0 = 0;
                local_224 = *(float *)*local_220;
                local_1c8 = local_220;
                if (local_4d0 <= 0.0) {
                  local_214[0] = local_4d0 * local_224;
                }
                break;
              case 3:
                local_1e0 = 0;
                local_228 = *(float *)*local_220;
                local_1f0 = 1;
                local_22c = *(float *)(*local_220 + 4);
                if (local_4d0 < local_228) {
                  local_214[0] = local_228;
                }
                local_1e8 = local_220;
                local_1d8 = local_220;
                if (local_22c < local_214[0]) {
                  local_214[0] = local_22c;
                }
                break;
              case 4:
                local_230 = 88.37626;
                pfVar1 = std::min<float>(local_214,&local_230);
                local_214[0] = *pfVar1;
                local_234 = -88.37626;
                pfVar1 = std::max<float>(local_214,&local_234);
                local_214[0] = *pfVar1;
                fVar3 = expf(-local_214[0]);
                local_214[0] = 1.0 / (fVar3 + 1.0);
                break;
              case 5:
                fVar3 = expf(local_4d0);
                fVar3 = logf(fVar3 + 1.0);
                local_214[0] = tanhf(fVar3);
                local_214[0] = local_4d0 * local_214[0];
                break;
              case 6:
                local_200 = 0;
                local_238 = *(float *)*local_220;
                local_214[1] = 1.4013e-45;
                local_214[2] = 0.0;
                local_23c = *(float *)(*local_220 + 4);
                local_240 = -local_23c / local_238;
                local_244 = 1.0 / local_238 + local_240;
                local_208 = local_220;
                local_1f8 = local_220;
                if (local_240 <= local_4d0) {
                  if (local_4d0 <= local_244) {
                    local_214[0] = local_4d0 * (local_4d0 * local_238 + local_23c);
                  }
                }
                else {
                  local_214[0] = 0.0;
                }
              }
              *(float *)(local_478 + (long)local_4cc * 4) = local_214[0];
              in_stack_fffffffffffff994 = local_214[0];
            }
            local_478 = local_478 + (long)local_41c * 4;
          }
        }
      }
      local_32c = 0;
    }
    local_418 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  }
  else {
    local_32c = -100;
    local_418 = 1;
  }
  ppvVar4 = &local_3c0;
  if (local_3b8 != (int *)0x0) {
    local_18c = 0xffffffff;
    LOCK();
    local_190 = *local_3b8;
    *local_3b8 = *local_3b8 + -1;
    UNLOCK();
    if (local_190 == 1) {
      local_2f0 = ppvVar4;
      local_188 = ppvVar4;
      if (local_3a0 == (long *)0x0) {
        local_f0 = local_3c0;
        if (local_3c0 != (void *)0x0) {
          free(local_3c0);
        }
      }
      else {
        (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return local_32c;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}